

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFilter.cpp
# Opt level: O0

bool __thiscall TestFilter::match(TestFilter *this,SimpleString *name)

{
  bool local_29;
  bool local_19;
  bool matches;
  SimpleString *name_local;
  TestFilter *this_local;
  
  if ((this->strictMatching_ & 1U) == 0) {
    local_19 = SimpleString::contains(name,&this->filter_);
  }
  else {
    local_19 = ::operator==(name,&this->filter_);
  }
  if ((this->invertMatching_ & 1U) == 0) {
    local_29 = local_19;
  }
  else {
    local_29 = (bool)(local_19 ^ 0xff);
  }
  return (bool)(local_29 & 1);
}

Assistant:

bool TestFilter::match(const SimpleString& name) const
{
    bool matches = false;

    if(strictMatching_)
        matches = name == filter_;
    else
        matches = name.contains(filter_);

    return invertMatching_ ? !matches : matches;
}